

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.hpp
# Opt level: O2

void __thiscall
ableton::platforms::asio::Socket<512ul>::
receive<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,512ul>::SocketReceiver<ableton::discovery::UnicastTag,ableton::util::SafeAsyncHandler<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,512ul>,ableton::link::PeerState,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&>::Impl>>>
          (Socket<512ul> *this,
          SocketReceiver<ableton::discovery::UnicastTag,_ableton::util::SafeAsyncHandler<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl>_>
          *handler)

{
  basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>> *this_00;
  SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl> SStack_48;
  mutable_buffers_1 local_38;
  
  std::
  function<void(asio::ip::basic_endpoint<asio::ip::udp>const&,unsigned_char_const*,unsigned_char_const*)>
  ::operator=((function<void(asio::ip::basic_endpoint<asio::ip::udp>const&,unsigned_char_const*,unsigned_char_const*)>
               *)(*(long *)this + 0x240),handler);
  this_00 = *(basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>> **)
             this;
  local_38.super_mutable_buffer.data_ = this_00 + 0x3c;
  local_38.super_mutable_buffer.size_ = 0x200;
  std::__weak_ptr<ableton::platforms::asio::Socket<512ul>::Impl,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<ableton::platforms::asio::Socket<512ul>::Impl,void>
            ((__weak_ptr<ableton::platforms::asio::Socket<512ul>::Impl,(__gnu_cxx::_Lock_policy)2> *
             )&SStack_48,
             (__shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
              *)this);
  ::asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
  async_receive_from<asio::mutable_buffers_1,ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512ul>::Impl>>
            (this_00,&local_38,(endpoint_type *)(this_00 + 0x20),&SStack_48);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&SStack_48.mpDelegate.
              super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void receive(Handler handler)
  {
    mpImpl->mHandler = std::move(handler);
    mpImpl->mSocket.async_receive_from(
      ::asio::buffer(mpImpl->mReceiveBuffer, MaxPacketSize), mpImpl->mSenderEndpoint,
      util::makeAsyncSafe(mpImpl));
  }